

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

ScriptFunction * __thiscall
Js::DiagStackFrame::TryGetFunctionForEval
          (DiagStackFrame *this,ScriptContext *scriptContext,char16 *source,int sourceLength,
          BOOL isLibraryCode)

{
  Type p_Var1;
  BOOL BVar2;
  GlobalObject *pGVar3;
  ScriptFunction *pSVar4;
  uint local_2c;
  uint32 grfscr;
  BOOL isLibraryCode_local;
  int sourceLength_local;
  char16 *source_local;
  ScriptContext *scriptContext_local;
  DiagStackFrame *this_local;
  
  local_2c = 0x401c02;
  BVar2 = IsThisAvailable(this);
  if (BVar2 == 0) {
    local_2c = 0x601c02;
  }
  if (isLibraryCode != 0) {
    local_2c = local_2c | 0x20000;
  }
  pGVar3 = ScriptContextBase::GetGlobalObject(&scriptContext->super_ScriptContextBase);
  p_Var1 = pGVar3->EvalHelper;
  BVar2 = IsStrictMode(this);
  pSVar4 = (*p_Var1)(scriptContext,source,sourceLength,0,local_2c,L"eval code",0,0,BVar2);
  return pSVar4;
}

Assistant:

Js::ScriptFunction* DiagStackFrame::TryGetFunctionForEval(Js::ScriptContext* scriptContext, const char16 *source, int sourceLength, BOOL isLibraryCode /* = FALSE */)
    {
        // TODO: pass the real length of the source code instead of wcslen
        uint32 grfscr = fscrReturnExpression | fscrEval | fscrEvalCode | fscrGlobalCode | fscrConsoleScopeEval;
        if (!this->IsThisAvailable())
        {
            grfscr |= fscrDebuggerErrorOnGlobalThis;
        }
        if (isLibraryCode)
        {
            grfscr |= fscrIsLibraryCode;
        }
        return scriptContext->GetGlobalObject()->EvalHelper(scriptContext, source, sourceLength, kmodGlobal, grfscr, Js::Constants::EvalCode, FALSE, FALSE, this->IsStrictMode());
    }